

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

string * fs_normal_abi_cxx11_(string_view path)

{
  size_t __n;
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool bVar4;
  allocator<char> local_a1;
  path local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)&stack0xffffffffffffffa8,&local_30,auto_format);
  std::filesystem::__cxx11::path::lexically_normal();
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_78,&local_a0,&local_a1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_RDI,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffffa8);
  uVar3 = in_RDI->_M_string_length;
  if (uVar3 < 2) goto LAB_00112c62;
  if ((in_RDI->_M_dataplus)._M_p[uVar3 - 1] == '/') {
    _Var1 = fs_is_windows();
    if (_Var1) {
      fs_root_abi_cxx11_(in_stack_ffffffffffffffa8);
      __n = in_RDI->_M_string_length;
      if (__n == local_a0._M_pathname._M_string_length) {
        if (__n == 0) {
          bVar4 = false;
        }
        else {
          iVar2 = bcmp((in_RDI->_M_dataplus)._M_p,local_a0._M_pathname._M_dataplus._M_p,__n);
          bVar4 = iVar2 != 0;
        }
      }
      else {
        bVar4 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_pathname._M_dataplus._M_p != &local_a0._M_pathname.field_2) {
        operator_delete(local_a0._M_pathname._M_dataplus._M_p,
                        local_a0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_00112c5e;
    }
    std::__cxx11::string::pop_back();
  }
LAB_00112c5e:
  uVar3 = in_RDI->_M_string_length;
LAB_00112c62:
  if (uVar3 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,'.');
  }
  return in_RDI;
}

Assistant:

std::string
fs_normal(std::string_view path)
{
  // normalize path
   std::string r;
#ifdef HAVE_CXX_FILESYSTEM
  r = std::filesystem::path(path).lexically_normal().generic_string();
#else
  // leave the empty short-circuit to avoid needless computation
  // and avoid indexing into an empty string
  if (path.empty())
    return ".";

  const std::vector<std::string> parts = fs_normal_vector(path);

  // rebuild path
   if (fs_slash_first(path))
     r.push_back('/');

  for (const auto& p : parts)
    r.append(p).push_back('/');

#endif

  // no trailing slash
  if (r.length() > 1 && r.back() == '/' && (!fs_is_windows() || r != fs_root(r)))
    r.pop_back();

  if (r.empty())
    r.push_back('.');

  return r;
}